

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::FinishScopeInfo(Parser *this,ScopeInfo *scopeInfo)

{
  int iVar1;
  ThreadContext *this_00;
  Scope *pSVar2;
  anon_class_16_2_40d8253c fn;
  ScopeInfo *pSStack_18;
  int scopeId;
  ScopeInfo *scopeInfo_local;
  Parser *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x2400,this->m_scriptContext,(PVOID)0x0);
  for (pSStack_18 = scopeInfo; pSStack_18 != (ScopeInfo *)0x0;
      pSStack_18 = Js::ScopeInfo::GetParentScopeInfo(pSStack_18)) {
    iVar1 = Js::ScopeInfo::GetScopeId(pSStack_18);
    pSVar2 = Js::ScopeInfo::GetScope(pSStack_18);
    fn.scopeId = iVar1;
    fn.this = this;
    fn._12_4_ = 0;
    Scope::ForEachSymbol<Parser::FinishScopeInfo(Js::ScopeInfo*)::__0>(pSVar2,fn);
    pSVar2 = Js::ScopeInfo::GetScope(pSStack_18);
    PopScope(this,pSVar2);
    PopStmt(this,&this->m_currentBlockInfo->pstmt);
    PopBlockInfo(this);
  }
  return;
}

Assistant:

void Parser::FinishScopeInfo(Js::ScopeInfo * scopeInfo)
{
    PROBE_STACK_NO_DISPOSE(m_scriptContext, Js::Constants::MinStackByteCodeVisitor);

    for (; scopeInfo != nullptr; scopeInfo = scopeInfo->GetParentScopeInfo())
    {
        int scopeId = scopeInfo->GetScopeId();

        scopeInfo->GetScope()->ForEachSymbol([this, scopeId](Symbol *sym)
        {
            this->BindPidRefsInScope(sym->GetPid(), sym, scopeId);
        });
        PopScope(scopeInfo->GetScope());
        PopStmt(&m_currentBlockInfo->pstmt);
        PopBlockInfo();
    }
}